

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

Emulator * emulator_new(EmulatorInit *init)

{
  Result RVar1;
  Emulator *e;
  EmulatorInit *init_local;
  
  init_local = (EmulatorInit *)calloc(1,0x82d08);
  RVar1 = set_rom_file_data((Emulator *)init_local,&init->rom);
  if (((RVar1 != OK) || (RVar1 = init_emulator((Emulator *)init_local,init), RVar1 != OK)) ||
     (RVar1 = init_audio_buffer((Emulator *)init_local,init->audio_frequency,init->audio_frames),
     RVar1 != OK)) {
    emulator_delete((Emulator *)init_local);
    init_local = (EmulatorInit *)0x0;
  }
  return (Emulator *)init_local;
}

Assistant:

Emulator* emulator_new(const EmulatorInit* init) {
  Emulator* e = xcalloc(1, sizeof(Emulator));
  CHECK(SUCCESS(set_rom_file_data(e, &init->rom)));
  CHECK(SUCCESS(init_emulator(e, init)));
  CHECK(
      SUCCESS(init_audio_buffer(e, init->audio_frequency, init->audio_frames)));
  return e;
error:
  emulator_delete(e);
  return NULL;
}